

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  LogMessage *pLVar1;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  Extension *local_20;
  Extension *extension;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension._4_4_ = number;
  pEStack_10 = this;
  local_20 = FindOrNull(this,number);
  if (local_20 != (Extension *)0x0) {
    return (void *)(local_20->field_0).int64_t_value;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,"extension != nullptr");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,0x1c7,local_48._M_len,local_48._M_str);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [21])"Extension not found.");
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar1);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Extension not found.";
  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->ptr.repeated_int32_t_value;
}